

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

void wwTrimHi(word *a,size_t n,size_t pos)

{
  long lVar1;
  byte bVar2;
  size_t i;
  size_t pos_local;
  size_t n_local;
  word *a_local;
  
  i = pos >> 6;
  if (i < n) {
    lVar1 = 0x40 - (pos & 0x3f);
    if (lVar1 == 0x40) {
      a[i] = 0;
    }
    else {
      bVar2 = (byte)lVar1;
      a[i] = a[i] << (bVar2 & 0x3f);
      a[i] = a[i] >> (bVar2 & 0x3f);
    }
    while (i = i + 1, i < n) {
      a[i] = 0;
    }
  }
  return;
}

Assistant:

void wwTrimHi(word a[], size_t n, size_t pos)
{
	size_t i = pos / B_PER_W;
	ASSERT(wwIsValid(a, n));
	if (i < n)
	{
		pos = B_PER_W - pos % B_PER_W;
		// очистить биты слова a[i]
		if (pos == B_PER_W)
			a[i] = 0;
		else
			a[i] <<= pos, a[i] >>= pos;
		// очистить остальные слова
		while (++i < n)
			a[i] = 0;
	}
}